

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_chown(void)

{
  ssize_t sVar1;
  int iVar2;
  uv_loop_t *loop;
  undefined8 uVar3;
  char *pcVar4;
  uv_fs_t req;
  
  unlink("test_file");
  unlink("test_file_link");
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&req,"test_file",0x42,0x180,0);
  sVar1 = req.result;
  if (iVar2 < 0) {
    pcVar4 = "r >= 0";
    uVar3 = 0x6ea;
  }
  else if (req.result < 0) {
    pcVar4 = "req.result >= 0";
    uVar3 = 0x6eb;
  }
  else {
    uv_fs_req_cleanup(&req);
    iVar2 = uv_fs_chown(0,&req,"test_file",0xffffffffffffffff,0xffffffff,0);
    if (iVar2 == 0) {
      if (req.result == 0) {
        uv_fs_req_cleanup(&req);
        iVar2 = uv_fs_fchown(0,&req,sVar1 & 0xffffffff,0xffffffffffffffff,0xffffffff,0);
        if (iVar2 == 0) {
          if (req.result == 0) {
            uv_fs_req_cleanup(&req);
            iVar2 = uv_fs_chown(::loop,&req,"test_file",0xffffffffffffffff,0xffffffff,chown_cb);
            if (iVar2 == 0) {
              uv_run(::loop,0);
              if (chown_cb_count == 1) {
                chown_cb_count = 0;
                iVar2 = uv_fs_chown(::loop,&req,"test_file",0,0,chown_root_cb);
                if (iVar2 == 0) {
                  uv_run(::loop,0);
                  if (chown_cb_count == 1) {
                    iVar2 = uv_fs_fchown(::loop,&req,sVar1 & 0xffffffff,0xffffffffffffffff,
                                         0xffffffff,fchown_cb);
                    if (iVar2 == 0) {
                      uv_run(::loop,0);
                      if (fchown_cb_count == 1) {
                        iVar2 = uv_fs_link(0,&req,"test_file","test_file_link",0);
                        if (iVar2 == 0) {
                          if (req.result == 0) {
                            uv_fs_req_cleanup(&req);
                            iVar2 = uv_fs_lchown(0,&req,"test_file_link",0xffffffffffffffff,
                                                 0xffffffff,0);
                            if (iVar2 == 0) {
                              if (req.result == 0) {
                                uv_fs_req_cleanup(&req);
                                iVar2 = uv_fs_lchown(::loop,&req,"test_file_link",0xffffffffffffffff
                                                     ,0xffffffff,lchown_cb);
                                if (iVar2 == 0) {
                                  uv_run(::loop,0);
                                  if (lchown_cb_count == 1) {
                                    iVar2 = uv_fs_close(0,&req,sVar1 & 0xffffffff,0);
                                    if (iVar2 == 0) {
                                      if (req.result == 0) {
                                        uv_fs_req_cleanup(&req);
                                        uv_run(::loop,0);
                                        unlink("test_file");
                                        unlink("test_file_link");
                                        loop = (uv_loop_t *)uv_default_loop();
                                        close_loop(loop);
                                        uVar3 = uv_default_loop();
                                        iVar2 = uv_loop_close(uVar3);
                                        if (iVar2 == 0) {
                                          return 0;
                                        }
                                        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                                        uVar3 = 0x735;
                                      }
                                      else {
                                        pcVar4 = "req.result == 0";
                                        uVar3 = 0x728;
                                      }
                                    }
                                    else {
                                      pcVar4 = "r == 0";
                                      uVar3 = 0x727;
                                    }
                                  }
                                  else {
                                    pcVar4 = "lchown_cb_count == 1";
                                    uVar3 = 0x722;
                                  }
                                }
                                else {
                                  pcVar4 = "r == 0";
                                  uVar3 = 0x720;
                                }
                              }
                              else {
                                pcVar4 = "req.result == 0";
                                uVar3 = 0x71b;
                              }
                            }
                            else {
                              pcVar4 = "r == 0";
                              uVar3 = 0x71a;
                            }
                          }
                          else {
                            pcVar4 = "req.result == 0";
                            uVar3 = 0x715;
                          }
                        }
                        else {
                          pcVar4 = "r == 0";
                          uVar3 = 0x714;
                        }
                      }
                      else {
                        pcVar4 = "fchown_cb_count == 1";
                        uVar3 = 0x70e;
                      }
                    }
                    else {
                      pcVar4 = "r == 0";
                      uVar3 = 0x70c;
                    }
                  }
                  else {
                    pcVar4 = "chown_cb_count == 1";
                    uVar3 = 0x707;
                  }
                }
                else {
                  pcVar4 = "r == 0";
                  uVar3 = 0x705;
                }
              }
              else {
                pcVar4 = "chown_cb_count == 1";
                uVar3 = 0x6ff;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0x6fd;
            }
          }
          else {
            pcVar4 = "req.result == 0";
            uVar3 = 0x6f8;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x6f7;
        }
      }
      else {
        pcVar4 = "req.result == 0";
        uVar3 = 0x6f2;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x6f1;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_chown) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  /* sync chown */
  r = uv_fs_chown(NULL, &req, "test_file", -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync fchown */
  r = uv_fs_fchown(NULL, &req, file, -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async chown */
  r = uv_fs_chown(loop, &req, "test_file", -1, -1, chown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chown_cb_count == 1);

#ifndef __MVS__
  /* chown to root (fail) */
  chown_cb_count = 0;
  r = uv_fs_chown(loop, &req, "test_file", 0, 0, chown_root_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chown_cb_count == 1);
#endif

  /* async fchown */
  r = uv_fs_fchown(loop, &req, file, -1, -1, fchown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fchown_cb_count == 1);

#ifndef __HAIKU__
  /* Haiku doesn't support hardlink */
  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync lchown */
  r = uv_fs_lchown(NULL, &req, "test_file_link", -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async lchown */
  r = uv_fs_lchown(loop, &req, "test_file_link", -1, -1, lchown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(lchown_cb_count == 1);
#endif

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");

  MAKE_VALGRIND_HAPPY();
  return 0;
}